

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_service.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::ServiceGenerator::GenerateMethodSignatures
          (ServiceGenerator *this,VirtualOrNon virtual_or_non,Printer *printer)

{
  long lVar1;
  ServiceDescriptor *pSVar2;
  char *pcVar3;
  long lVar4;
  long lVar5;
  Formatter format;
  char *local_90;
  string local_88;
  Formatter local_68;
  
  pSVar2 = this->descriptor_;
  if (0 < *(int *)(pSVar2 + 0x28)) {
    pcVar3 = "";
    if (virtual_or_non == VIRTUAL) {
      pcVar3 = "virtual ";
    }
    lVar4 = 0;
    lVar5 = 0;
    do {
      lVar1 = *(long *)(pSVar2 + 0x20);
      local_68.printer_ = printer;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_Rb_tree(&local_68.vars_._M_t,&(this->vars_)._M_t);
      anon_unknown_3::InitMethodVariables
                ((MethodDescriptor *)(lVar1 + lVar4),this->options_,&local_68);
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"virtual","");
      local_90 = pcVar3;
      Formatter::Set<char_const*>(&local_68,&local_88,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p);
      }
      Formatter::operator()<>
                (&local_68,
                 "$virtual$void $name$(::$proto_ns$::RpcController* controller,\n                     const $input_type$* request,\n                     $output_type$* response,\n                     ::google::protobuf::Closure* done);\n"
                );
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_68.vars_._M_t);
      lVar5 = lVar5 + 1;
      pSVar2 = this->descriptor_;
      lVar4 = lVar4 + 0x40;
    } while (lVar5 < *(int *)(pSVar2 + 0x28));
  }
  return;
}

Assistant:

void ServiceGenerator::GenerateMethodSignatures(VirtualOrNon virtual_or_non,
                                                io::Printer* printer) {
  for (int i = 0; i < descriptor_->method_count(); i++) {
    const MethodDescriptor* method = descriptor_->method(i);
    Formatter format(printer, vars_);
    InitMethodVariables(method, options_, &format);
    format.Set("virtual", virtual_or_non == VIRTUAL ? "virtual " : "");
    format(
        "$virtual$void $name$(::$proto_ns$::RpcController* controller,\n"
        "                     const $input_type$* request,\n"
        "                     $output_type$* response,\n"
        "                     ::google::protobuf::Closure* done);\n");
  }
}